

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void handleSpans<BlendSrcGenericRGBFP>(int count,QT_FT_Span *spans,QSpanData *data,Operator *op)

{
  char cVar1;
  int iVar2;
  int iVar3;
  QThreadPool *this;
  int iVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  anon_class_24_4_b418dff8_for_o local_78;
  undefined1 *local_60;
  anon_class_32_5_c407124e local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = 0x100;
  if (data->field_0x88 == '\x05') {
    iVar5 = (data->field_23).texture.const_alpha;
  }
  local_58._25_7_ = 0xaaaaaaaaaaaaaa;
  local_58.solidSource = iVar5 == 0x100 && op->mode == CompositionMode_Source;
  local_58.const_alpha = iVar5;
  iVar5 = count + 0x5f;
  if (-1 < count + 0x20) {
    iVar5 = count + 0x20;
  }
  local_58.op = op;
  local_58.data = data;
  local_58.spans = spans;
  this = QGuiApplicationPrivate::qtGuiThreadPool();
  if (((0x5f < count) && (this != (QThreadPool *)0x0)) &&
     (2 < (int)qPixelLayouts[data->rasterBuffer->format].bpp)) {
    QThread::currentThread();
    cVar1 = QThreadPool::contains((QThread *)this);
    if (cVar1 == '\0') {
      iVar5 = iVar5 >> 6;
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      iVar4 = 0;
      QSemaphore::QSemaphore((QSemaphore *)&local_60,0);
      iVar2 = 1;
      if (1 < iVar5) {
        iVar2 = iVar5;
      }
      iVar6 = 0;
      do {
        iVar3 = (count - iVar6) / (iVar4 + iVar5);
        local_78.function = &local_58;
        local_78.semaphore = (QSemaphore *)&local_60;
        local_78.c = iVar6;
        local_78.cn = iVar3;
        QThreadPool::
        start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_gui_painting_qdrawhelper_cpp:4205:5),_true>
                  (this,&local_78,1);
        iVar6 = iVar6 + iVar3;
        iVar4 = iVar4 + -1;
      } while (-iVar2 != iVar4);
      QSemaphore::acquire((int)(QSemaphore *)&local_60);
      QSemaphore::~QSemaphore((QSemaphore *)&local_60);
      goto LAB_006815a6;
    }
  }
  handleSpans<BlendSrcGenericRGBFP>::anon_class_32_5_c407124e::operator()
            ((anon_class_32_5_c407124e *)&local_58,0,count);
LAB_006815a6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void handleSpans(int count, const QT_FT_Span *spans, const QSpanData *data, const Operator &op)
{
    const int const_alpha = (data->type == QSpanData::Texture) ? data->texture.const_alpha : 256;
    const bool solidSource = op.mode == QPainter::CompositionMode_Source && const_alpha == 256;

    auto function = [=, &op] (int cStart, int cEnd)
    {
        T Q_DECL_UNINITIALIZED handler(data, op);
        int coverage = 0;
        for (int c = cStart; c < cEnd;) {
            if (!spans[c].len) {
                ++c;
                continue;
            }
            int x = spans[c].x;
            const int y = spans[c].y;
            int right = x + spans[c].len;
            const bool fetchDest = !solidSource || spans[c].coverage < 255;

            // compute length of adjacent spans
            for (int i = c + 1; i < cEnd && spans[i].y == y && spans[i].x == right && fetchDest == (!solidSource || spans[i].coverage < 255); ++i)
                right += spans[i].len;
            int length = right - x;

            while (length) {
                int l = qMin(BufferSize, length);
                length -= l;

                int process_length = l;
                int process_x = x;

                const auto *src = handler.fetch(process_x, y, process_length, fetchDest);
                int offset = 0;
                while (l > 0) {
                    if (x == spans[c].x) // new span?
                        coverage = (spans[c].coverage * const_alpha) >> 8;

                    int right = spans[c].x + spans[c].len;
                    int len = qMin(l, right - x);

                    handler.process(x, y, len, coverage, src, offset);

                    l -= len;
                    x += len;
                    offset += len;

                    if (x == right) // done with current span?
                        ++c;
                }
                handler.store(process_x, y, process_length);
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}